

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O3

void deqp::gls::anon_unknown_1::runTests
               (TestContext *testCtx,RenderContext *renderContext,Random *rng,deUint32 format,
               size_t bufferSize,size_t offset,size_t size,RenderBits preRender,
               ShaderProgram *preRenderProgram,ModifyBits modifyType,RenderBits postRender,
               ShaderProgram *postRenderProgram)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TextureFormat TVar2;
  uchar *puVar3;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ContextType CVar11;
  deUint32 dVar12;
  uint uVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ContextInfo *this;
  undefined4 extraout_var_01;
  size_t sVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar15;
  undefined4 extraout_var_04;
  TestError *pTVar16;
  ulong uVar17;
  long lVar18;
  undefined8 uVar19;
  size_t sVar20;
  int height;
  ulong uVar21;
  uchar uVar22;
  void *pvVar23;
  long lVar24;
  RenderContext *context;
  char *pcVar25;
  TextureFormat TVar26;
  size_t sVar27;
  size_t offset_00;
  float fVar28;
  size_type __dnew;
  ScopedLogSection section;
  Surface referenceTarget;
  ScopedLogSection section_2;
  ScopedLogSection modifySection;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufferData;
  ResultCollector resultCollector;
  string local_378;
  TextureFormat local_350;
  deRandom *local_348;
  size_t local_340;
  RenderContext *local_338;
  undefined1 local_330 [8];
  undefined8 local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  void *local_310;
  uchar *local_308;
  deUint32 local_2fc;
  string local_2f8;
  Surface local_2d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b8;
  int local_298;
  deUint32 local_294;
  int local_290;
  int local_28c;
  undefined1 local_288 [8];
  undefined1 auStack_280 [112];
  ios_base local_210 [264];
  Vec4 local_108;
  ScopedLogSection local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  TestContext *local_c8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  ResultCollector local_a8;
  deRandom local_58;
  deRandom local_48;
  
  local_348 = &rng->m_rnd;
  local_340 = bufferSize;
  local_294 = format;
  iVar8 = (*renderContext->_vptr_RenderContext[4])(renderContext);
  iVar10 = *(int *)CONCAT44(extraout_var,iVar8);
  iVar8 = ((int *)CONCAT44(extraout_var,iVar8))[1];
  iVar9 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  local_298 = 0x100;
  if (iVar10 < 0x100) {
    local_298 = iVar10;
  }
  height = 0x100;
  if (iVar8 < 0x100) {
    height = iVar8;
  }
  local_108.m_data[0] = (float)0x3e800000;
  local_108.m_data[1] = (float)0x3f000000;
  local_108.m_data[2] = (float)0x3f400000;
  local_108.m_data[3] = (float)0x3f800000;
  TVar26 = (TextureFormat)testCtx->m_log;
  local_288 = (undefined1  [8])((long)auStack_280 + 8);
  local_290 = iVar10;
  local_28c = iVar8;
  local_c8 = testCtx;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,0x1af8059);
  tcu::ResultCollector::ResultCollector(&local_a8,(TestLog *)TVar26,(string *)local_288);
  if (local_288 != (undefined1  [8])((long)auStack_280 + 8)) {
    operator_delete((void *)local_288,auStack_280._8_8_ + 1);
  }
  local_288 = (undefined1  [8])((long)auStack_280 + 8);
  local_330._0_4_ = CHANNELORDER_LAST;
  local_330._4_4_ = SNORM_INT8;
  local_350 = TVar26;
  local_c0 = CONCAT44(extraout_var_00,iVar9);
  local_288 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_288,(ulong)local_330);
  auStack_280._8_8_ = local_330;
  *(undefined8 *)local_288 = 0x6e656d656c706d49;
  ((TestLog *)((long)local_288 + 8))->m_log = (qpTestLog *)0x56206e6f69746174;
  builtin_strncpy((char *)((long)local_288 + 0xd),"n Values",8);
  auStack_280._0_8_ = local_330;
  *(char *)((long)local_288 + (long)local_330) = '\0';
  local_378._M_dataplus._M_p = (pointer)0x15;
  local_330 = (undefined1  [8])&local_320;
  local_330 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_330,(ulong)&local_378)
  ;
  local_320._M_allocated_capacity = (size_type)local_378._M_dataplus._M_p;
  *(undefined8 *)local_330 = 0x6e656d656c706d49;
  builtin_strncpy((char *)((long)local_330 + 8),"tation V",8);
  builtin_strncpy((char *)((long)local_330 + 0xd),"n Values",8);
  local_328 = (TestLog *)local_378._M_dataplus._M_p;
  local_378._M_dataplus._M_p[(long)local_330] = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_2f8,(TestLog *)local_350,(string *)local_288,
             (string *)local_330);
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330,(ulong)(local_320._M_allocated_capacity + 1));
  }
  if (local_288 != (undefined1  [8])((long)auStack_280 + 8)) {
    operator_delete((void *)local_288,auStack_280._8_8_ + 1);
  }
  this = glu::ContextInfo::create(renderContext);
  local_338 = renderContext;
  iVar10 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  lVar24 = CONCAT44(extraout_var_01,iVar10);
  CVar11.super_ApiType.m_bits = (ApiType)(*local_338->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(CVar11,(ApiType)0x133);
  if (bVar6) {
    local_330 = (undefined1  [8])((ulong)local_330 & 0xffffffff00000000);
    (**(code **)(lVar24 + 0x868))(0x8c2b);
    dVar12 = (**(code **)(lVar24 + 0x800))();
    glu::checkError(dVar12,"glGetIntegerv(GL_MAX_TEXTURE_BUFFER_SIZE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                    ,0x325);
    local_288._0_4_ = local_350.order;
    local_288._4_4_ = local_350.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_280,"GL_MAX_TEXTURE_BUFFER_SIZE : ",0x1d);
    std::ostream::operator<<((ostringstream *)auStack_280,local_330._0_4_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0189cd40:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
    std::ios_base::~ios_base(local_210);
  }
  else {
    CVar11.super_ApiType.m_bits = (ApiType)(*local_338->_vptr_RenderContext[2])();
    bVar6 = glu::contextSupports(CVar11,(ApiType)0x13);
    if ((bVar6) &&
       (bVar6 = glu::ContextInfo::isExtensionSupported(this,"GL_EXT_texture_buffer"), bVar6)) {
      local_330 = (undefined1  [8])((ulong)local_330 & 0xffffffff00000000);
      (**(code **)(lVar24 + 0x868))(0x8c2b);
      dVar12 = (**(code **)(lVar24 + 0x800))();
      glu::checkError(dVar12,"glGetIntegerv(GL_MAX_TEXTURE_BUFFER_SIZE_EXT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x32f);
      local_288._0_4_ = local_350.order;
      local_288._4_4_ = local_350.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_280,"GL_MAX_TEXTURE_BUFFER_SIZE_EXT : ",0x21);
      std::ostream::operator<<((ostringstream *)auStack_280,local_330._0_4_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
      std::ios_base::~ios_base(local_210);
      local_330 = (undefined1  [8])((ulong)local_330 & 0xffffffff00000000);
      (**(code **)(lVar24 + 0x868))(0x919f);
      dVar12 = (**(code **)(lVar24 + 0x800))();
      glu::checkError(dVar12,"glGetIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT_EXT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x338);
      local_288._0_4_ = local_350.order;
      local_288._4_4_ = local_350.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_280,"GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT_EXT : ",0x29);
      std::ostream::operator<<((ostringstream *)auStack_280,local_330._0_4_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_0189cd40;
    }
  }
  if (this != (ContextInfo *)0x0) {
    (*this->_vptr_ContextInfo[1])(this);
  }
  tcu::TestLog::endSection((TestLog *)local_2f8._M_dataplus._M_p);
  local_288 = (undefined1  [8])((long)auStack_280 + 8);
  auStack_280._8_8_ = (uchar *)0x2065727574786554;
  auStack_280._16_4_ = 0x6f666e49;
  auStack_280._0_8_ = (_func_int **)0xc;
  auStack_280[0x14] = '\0';
  local_320._M_allocated_capacity = 0x2065727574786554;
  local_328 = (TestLog *)0xc;
  local_320._8_5_ = 0x6f666e49;
  local_330 = (undefined1  [8])&local_320;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_378,(TestLog *)local_350,(string *)local_288,
             (string *)local_330);
  context = local_338;
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330,(ulong)(local_320._M_allocated_capacity + 1));
  }
  TVar26 = local_350;
  if (local_288 != (undefined1  [8])((long)auStack_280 + 8)) {
    operator_delete((void *)local_288,(ulong)(auStack_280._8_8_ + 1));
  }
  TVar2 = local_350;
  local_350.order = TVar26.order;
  local_350.type = TVar26.type;
  local_288._0_4_ = local_350.order;
  local_288._4_4_ = local_350.type;
  local_350 = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_280,"Texture format : ",0x11);
  local_330 = (undefined1  [8])glu::getTextureFormatName;
  local_328 = (TestLog *)CONCAT44(local_328._4_4_,local_294);
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_330,(ostream *)auStack_280);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
  std::ios_base::~ios_base(local_210);
  TVar26 = local_350;
  local_288._0_4_ = local_350.order;
  local_288._4_4_ = local_350.type;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_280,"Buffer size : ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)auStack_280);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
  std::ios_base::~ios_base(local_210);
  TVar2 = local_350;
  if (size != 0 || offset != 0) {
    local_350.order = TVar26.order;
    local_350.type = TVar26.type;
    local_288._0_4_ = local_350.order;
    local_288._4_4_ = local_350.type;
    local_350 = TVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_280,"Buffer range offset: ",0x15);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_280);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
    std::ios_base::~ios_base(local_210);
    TVar26 = local_350;
    local_288._0_4_ = local_350.order;
    local_288._4_4_ = local_350.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_280,"Buffer range size: ",0x13);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_280);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
    std::ios_base::~ios_base(local_210);
  }
  tcu::TestLog::endSection((TestLog *)local_378._M_dataplus._M_p);
  tcu::Surface::Surface(&local_2d0,local_298,height);
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.x = local_348->x;
  local_58.y = local_348->y;
  local_58.z = local_348->z;
  local_58.w = local_348->w;
  genRandomCoords((Random *)&local_58,&local_e8,0,local_340);
  uVar17 = 0;
  uVar21 = 0;
  do {
    if (uVar17 < size + offset && offset <= uVar17) {
      uVar22 = 'U';
      if (uVar21 < 2) {
        uVar22 = 0xaa;
      }
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17 * 2] = uVar22;
      uVar22 = 'U';
      if ((uVar21 & 1) == 0) {
        uVar22 = 0xaa;
      }
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17 * 2 + 1] = uVar22;
    }
    uVar21 = uVar21 + 1;
    uVar17 = uVar17 + 0x55;
  } while (uVar21 != 4);
  glu::TextureBuffer::TextureBuffer
            ((TextureBuffer *)local_330,context,local_294,local_340,offset,size,
             local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  lVar24 = local_c0;
  if (local_28c < 0x40 && local_290 < 0x40) {
    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar16,"Too small viewport",
               "width >= MIN_VIEWPORT_WIDTH || height >= MIN_VIEWPORT_HEIGHT",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
               ,0x381);
    __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(local_c0 + 0x1a00))(0,0,local_298,height);
  (**(code **)(lVar24 + 0x1c0))
            (local_108.m_data[0],local_108.m_data[1],local_108.m_data[2],local_108.m_data[3]);
  (**(code **)(lVar24 + 0x188))(0x4000);
  dVar12 = (**(code **)(lVar24 + 0x800))();
  glu::checkError(dVar12,"Screen setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                  ,0x389);
  local_378._M_dataplus._M_p = (pointer)0x300000008;
  pvVar23 = (void *)local_2d0.m_pixels.m_cap;
  if ((void *)local_2d0.m_pixels.m_cap != (void *)0x0) {
    pvVar23 = local_2d0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_288,(TextureFormat *)&local_378,local_2d0.m_width,
             local_2d0.m_height,1,pvVar23);
  tcu::clear((PixelBufferAccess *)local_288,&local_108);
  glu::TextureBuffer::upload((TextureBuffer *)local_330);
  if (preRender != RENDERBITS_NONE) {
    local_378._M_dataplus._M_p = (pointer)0x300000008;
    pvVar23 = (void *)local_2d0.m_pixels.m_cap;
    if ((void *)local_2d0.m_pixels.m_cap != (void *)0x0) {
      pvVar23 = local_2d0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,(TextureFormat *)&local_378,local_2d0.m_width,
               local_2d0.m_height,1,pvVar23);
    render((TestLog *)TVar26,context,preRender,(Random *)local_348,preRenderProgram,
           (TextureBuffer *)local_330,(PixelBufferAccess *)local_288);
  }
  if (modifyType == MODIFYBITS_NONE) goto LAB_0189e1a5;
  local_288 = (undefined1  [8])((long)auStack_280 + 8);
  local_378._M_dataplus._M_p = (pointer)0x18;
  local_288 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_288,(ulong)&local_378)
  ;
  paVar1 = &local_378.field_2;
  auStack_280._8_8_ = local_378._M_dataplus._M_p;
  *(undefined8 *)local_288 = 0x6e69796669646f4d;
  builtin_strncpy((char *)((long)local_288 + 8),"g Textur",8);
  builtin_strncpy((char *)((long)local_288 + 0x10),"e buffer",8);
  auStack_280._0_8_ = local_378._M_dataplus._M_p;
  local_378._M_dataplus._M_p[(long)local_288] = '\0';
  local_2f8._M_dataplus._M_p = (pointer)0x18;
  local_378._M_dataplus._M_p = (pointer)paVar1;
  local_378._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_378,(ulong)&local_2f8);
  local_378.field_2._M_allocated_capacity = (size_type)local_2f8._M_dataplus._M_p;
  builtin_strncpy(local_378._M_dataplus._M_p,"Modifying Texture Buffer",0x18);
  local_378._M_string_length = (size_type)local_2f8._M_dataplus._M_p;
  local_378._M_dataplus._M_p[(long)local_2f8._M_dataplus._M_p] = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            (&local_f0,(TestLog *)TVar26,(string *)local_288,&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar1) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != (undefined1  [8])((long)auStack_280 + 8)) {
    operator_delete((void *)local_288,auStack_280._8_8_ + 1);
  }
  local_288 = (undefined1  [8])((long)auStack_280 + 8);
  local_378._M_dataplus._M_p = (pointer)0x11;
  local_288 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_288,(ulong)&local_378)
  ;
  auStack_280._8_8_ = local_378._M_dataplus._M_p;
  *(undefined8 *)local_288 = 0x4f20796669646f4d;
  ((TestLog *)((long)local_288 + 8))->m_log = (qpTestLog *)0x6e6f697461726570;
  *(char *)&((TestLog *)((long)local_288 + 0x10))->m_log = 's';
  auStack_280._0_8_ = local_378._M_dataplus._M_p;
  local_378._M_dataplus._M_p[(long)local_288] = '\0';
  local_2f8._M_dataplus._M_p = (pointer)0x11;
  local_378._M_dataplus._M_p = (pointer)paVar1;
  local_378._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_378,(ulong)&local_2f8);
  local_378.field_2._M_allocated_capacity = (size_type)local_2f8._M_dataplus._M_p;
  builtin_memcpy(local_378._M_dataplus._M_p,"Modify Operations",0x11);
  local_378._M_string_length = (size_type)local_2f8._M_dataplus._M_p;
  ((uchar *)local_378._M_dataplus._M_p)[(long)local_2f8._M_dataplus._M_p] = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_2b8,(TestLog *)TVar26,(string *)local_288,&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar1) {
    operator_delete(local_378._M_dataplus._M_p,(ulong)(local_378.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_288 != (undefined1  [8])((long)auStack_280 + 8)) {
    operator_delete((void *)local_288,(ulong)(auStack_280._8_8_ + 1));
  }
  lVar24 = 0;
  do {
    if ((*(ModifyBits *)((long)&DAT_02188090 + lVar24) & modifyType) != MODIFYBITS_NONE) {
      local_288 = (undefined1  [8])TVar26;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
      pcVar25 = *(char **)((long)&PTR_anon_var_dwarf_4a8911d_02188098 + lVar24);
      if (pcVar25 == (char *)0x0) {
        std::ios::clear((int)auStack_280 + (int)*(_func_int **)(auStack_280._0_8_ + -0x18));
      }
      else {
        sVar14 = strlen(pcVar25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_280,pcVar25,sVar14);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
      std::ios_base::~ios_base(local_210);
      TVar26 = local_350;
    }
    lVar24 = lVar24 + 0x10;
  } while (lVar24 != 0x40);
  tcu::TestLog::endSection
            ((TestLog *)
             local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  context = local_338;
  if ((modifyType & MODIFYBITS_BUFFERDATA) != MODIFYBITS_NONE) {
    local_378._M_dataplus._M_p = (pointer)0x0;
    local_378._M_string_length = 0;
    local_378.field_2._M_allocated_capacity = 0;
    local_2f8._M_dataplus._M_p = *(pointer *)local_348;
    local_2f8._M_string_length._0_4_ = local_348->z;
    local_2f8._M_string_length._4_4_ = local_348->w;
    genRandomCoords((Random *)&local_2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_378,0,
                    local_320._8_8_);
    local_288 = (undefined1  [8])TVar26;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_280,"BufferData, Size: ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_280);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
    std::ios_base::~ios_base(local_210);
    de::ArrayBuffer<unsigned_char,_1UL,_1UL>::ArrayBuffer
              ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)local_288,(uchar *)local_378._M_dataplus._M_p
               ,local_378._M_string_length - (long)local_378._M_dataplus._M_p);
    uVar5 = auStack_280._0_8_;
    auVar4 = local_288;
    uVar19 = local_320._M_allocated_capacity;
    local_288 = (undefined1  [8])local_320._M_allocated_capacity;
    auStack_280._0_8_ = local_320._8_8_;
    local_320._M_allocated_capacity = (size_type)auVar4;
    local_320._8_8_ = uVar5;
    de::detail::ArrayBuffer_AlignedFree((void *)uVar19);
    glu::TextureBuffer::upload((TextureBuffer *)local_330);
    if ((uchar *)local_378._M_dataplus._M_p != (uchar *)0x0) {
      operator_delete(local_378._M_dataplus._M_p,
                      local_378.field_2._M_allocated_capacity - (long)local_378._M_dataplus._M_p);
    }
  }
  if ((modifyType & MODIFYBITS_BUFFERSUBDATA) != MODIFYBITS_NONE) {
    iVar10 = (*context->_vptr_RenderContext[3])(context);
    puVar3 = local_308;
    uVar19 = local_320._8_8_;
    lVar24 = CONCAT44(extraout_var_02,iVar10);
    fVar28 = deRandom_getFloat(local_348);
    pvVar23 = local_310;
    if (puVar3 != (uchar *)0x0) {
      uVar19 = puVar3;
    }
    fVar28 = (fVar28 * 0.3 + 0.7) * (float)(ulong)uVar19;
    uVar17 = (ulong)fVar28;
    uVar17 = (long)(fVar28 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17;
    sVar20 = 0x40;
    if (0x40 < uVar17) {
      sVar20 = uVar17;
    }
    dVar12 = deRandom_getUint32(local_348);
    sVar27 = (ulong)dVar12 % ((local_320._8_8_ - (long)pvVar23) - sVar20) + (long)pvVar23;
    local_378._M_dataplus._M_p = (pointer)0x0;
    local_378._M_string_length = 0;
    local_378.field_2._M_allocated_capacity = 0;
    local_2f8._M_dataplus._M_p = *(pointer *)local_348;
    local_2f8._M_string_length._0_4_ = local_348->z;
    local_2f8._M_string_length._4_4_ = local_348->w;
    genRandomCoords((Random *)&local_2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_378,sVar27,
                    sVar20);
    TVar26 = local_350;
    local_288._0_4_ = local_350.order;
    local_288._4_4_ = local_350.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_280,"BufferSubData, Offset: ",0x17);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_280);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_280,", Size: ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_280);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar24 + 0x40))(0x8c2a,local_2fc);
    (**(code **)(lVar24 + 0x168))
              (0x8c2a,(long)(int)sVar27,
               (long)((int)local_378._M_string_length - (int)local_378._M_dataplus._M_p));
    (**(code **)(lVar24 + 0x40))(0x8c2a,0);
    dVar12 = (**(code **)(lVar24 + 0x800))();
    glu::checkError(dVar12,"Failed to update data with glBufferSubData()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                    ,0x1cb);
    memcpy((char *)(sVar27 + local_320._M_allocated_capacity),local_378._M_dataplus._M_p,
           (long)((int)local_378._M_string_length - (int)local_378._M_dataplus._M_p));
    context = local_338;
    if ((uchar *)local_378._M_dataplus._M_p != (uchar *)0x0) {
      operator_delete(local_378._M_dataplus._M_p,
                      local_378.field_2._M_allocated_capacity - (long)local_378._M_dataplus._M_p);
    }
  }
  if ((modifyType & MODIFYBITS_MAPBUFFER_WRITE) != MODIFYBITS_NONE) {
    iVar10 = (*context->_vptr_RenderContext[3])(context);
    puVar3 = local_308;
    uVar19 = local_320._8_8_;
    lVar24 = CONCAT44(extraout_var_03,iVar10);
    fVar28 = deRandom_getFloat(local_348);
    pvVar23 = local_310;
    if (puVar3 != (uchar *)0x0) {
      uVar19 = puVar3;
    }
    fVar28 = (fVar28 * 0.3 + 0.7) * (float)(ulong)uVar19;
    uVar17 = (ulong)fVar28;
    uVar17 = (long)(fVar28 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17;
    sVar20 = 0x40;
    if (0x40 < uVar17) {
      sVar20 = uVar17;
    }
    dVar12 = deRandom_getUint32(local_348);
    sVar27 = (ulong)dVar12 % ((local_320._8_8_ - (long)pvVar23) - sVar20) + (long)pvVar23;
    local_378._M_dataplus._M_p = (pointer)0x0;
    local_378._M_string_length = 0;
    local_378.field_2._M_allocated_capacity = 0;
    local_2f8._M_dataplus._M_p = *(pointer *)local_348;
    local_2f8._M_string_length._0_4_ = local_348->z;
    local_2f8._M_string_length._4_4_ = local_348->w;
    genRandomCoords((Random *)&local_2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_378,sVar27,
                    sVar20);
    TVar26 = local_350;
    local_288._0_4_ = local_350.order;
    local_288._4_4_ = local_350.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_280,"glMapBufferRange, Write Only, Offset: ",0x26);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_280);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_280,", Size: ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_280);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar24 + 0x40))(0x8c2a,local_2fc);
    context = local_338;
    lVar15 = (**(code **)(lVar24 + 0xd00))(0x8c2a,(long)(int)sVar27,(long)(int)sVar20,2);
    dVar12 = (**(code **)(lVar24 + 0x800))();
    glu::checkError(dVar12,"glMapBufferRange()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                    ,0x1e3);
    if (lVar15 == 0) {
      pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar16,(char *)0x0,"ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                 ,0x1e4);
LAB_0189e617:
      __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (0 < (int)local_378._M_string_length - (int)local_378._M_dataplus._M_p) {
      lVar18 = 0;
      do {
        *(char *)(lVar15 + lVar18) = local_378._M_dataplus._M_p[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar18 < (int)local_378._M_string_length - (int)local_378._M_dataplus._M_p);
    }
    cVar7 = (**(code **)(lVar24 + 0x1670))(0x8c2a);
    if (cVar7 == '\0') {
      pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar16,(char *)0x0,"gl.unmapBuffer(GL_TEXTURE_BUFFER)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                 ,0x1e9);
      goto LAB_0189e617;
    }
    (**(code **)(lVar24 + 0x40))(0x8c2a,0);
    dVar12 = (**(code **)(lVar24 + 0x800))();
    glu::checkError(dVar12,"Failed to update data with glMapBufferRange()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                    ,0x1ec);
    memcpy((char *)(sVar27 + local_320._M_allocated_capacity),local_378._M_dataplus._M_p,
           (long)((int)local_378._M_string_length - (int)local_378._M_dataplus._M_p));
    if ((uchar *)local_378._M_dataplus._M_p != (uchar *)0x0) {
      operator_delete(local_378._M_dataplus._M_p,
                      local_378.field_2._M_allocated_capacity - (long)local_378._M_dataplus._M_p);
    }
  }
  if ((modifyType & MODIFYBITS_MAPBUFFER_READWRITE) != MODIFYBITS_NONE) {
    iVar10 = (*context->_vptr_RenderContext[3])(context);
    uVar19 = local_320._8_8_;
    fVar28 = deRandom_getFloat(local_348);
    if (local_308 != (uchar *)0x0) {
      uVar19 = local_308;
    }
    fVar28 = (fVar28 * 0.3 + 0.7) * (float)(ulong)uVar19;
    uVar17 = (ulong)fVar28;
    uVar17 = (long)(fVar28 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17;
    sVar20 = 0x40;
    if (0x40 < uVar17) {
      sVar20 = uVar17;
    }
    dVar12 = deRandom_getUint32(local_348);
    offset_00 = (ulong)dVar12 % ((local_320._8_8_ - (long)local_310) - sVar20) + (long)local_310;
    pcVar25 = (char *)(local_320._M_allocated_capacity + offset_00);
    local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.x = local_348->x;
    local_48.y = local_348->y;
    local_48.z = local_348->z;
    local_48.w = local_348->w;
    local_340 = CONCAT44(extraout_var_04,iVar10);
    genRandomCoords((Random *)&local_48,&local_2b8,offset_00,sVar20);
    local_288._0_4_ = local_350.order;
    local_288._4_4_ = local_350.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_280,"glMapBufferRange, Read Write, Offset: ",0x26);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_280);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_280,", Size: ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_280);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
    std::ios_base::~ios_base(local_210);
    sVar27 = local_340;
    (**(code **)(local_340 + 0x40))(0x8c2a,local_2fc);
    lVar24 = (**(code **)(sVar27 + 0xd00))(0x8c2a,(long)(int)offset_00,(long)(int)sVar20,3);
    dVar12 = (**(code **)(local_340 + 0x800))();
    glu::checkError(dVar12,"glMapBufferRange()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                    ,0x207);
    if (lVar24 == 0) {
      pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar16,(char *)0x0,"ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                 ,0x208);
LAB_0189e685:
      __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if ((int)local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
        (int)local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start < 1) {
      uVar17 = 0;
    }
    else {
      lVar15 = 0;
      uVar17 = 0;
      do {
        if (*(char *)(lVar24 + lVar15) != pcVar25[lVar15]) {
          if (uVar17 < 0x18) {
            local_288._0_4_ = local_350.order;
            local_288._4_4_ = local_350.type;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_280,"Invalid byte in mapped buffer. ",0x1f);
            local_b0 = (ulong)*(byte *)((long)(qpTestLog **)
                                              local_2b8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar15);
            tcu::Format::Hex<2ul>::toString_abi_cxx11_(&local_378,&local_b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_280,local_378._M_dataplus._M_p,local_378._M_string_length)
            ;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_280," at ",4);
            std::ostream::operator<<((ostringstream *)auStack_280,(int)lVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_280,", expected ",0xb);
            local_b8 = (ulong)(byte)pcVar25[lVar15];
            tcu::Format::Hex<2ul>::toString_abi_cxx11_(&local_2f8,&local_b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_280,local_2f8._M_dataplus._M_p,local_2f8._M_string_length)
            ;
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,
                              (ulong)(local_378.field_2._M_allocated_capacity + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
            std::ios_base::~ios_base(local_210);
          }
          uVar17 = uVar17 + 1;
        }
        *(undefined1 *)(lVar24 + lVar15) =
             *(undefined1 *)
              ((long)(qpTestLog **)
                     local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar15);
        lVar15 = lVar15 + 1;
      } while (lVar15 < (int)local_2b8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                        (int)local_2b8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    }
    cVar7 = (**(code **)(local_340 + 0x1670))(0x8c2a);
    context = local_338;
    if (cVar7 == '\0') {
      pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar16,(char *)0x0,"gl.unmapBuffer(GL_TEXTURE_BUFFER)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                 ,0x217);
      goto LAB_0189e685;
    }
    if (uVar17 != 0) {
      local_288._0_4_ = local_350.order;
      local_288._4_4_ = local_350.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_280);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_280,"Total of ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_280," invalid bytes.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_280);
      std::ios_base::~ios_base(local_210);
      local_288 = (undefined1  [8])((long)auStack_280 + 8);
      local_378._M_dataplus._M_p = (pointer)0x1d;
      local_288 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_288,(ulong)&local_378);
      auStack_280._8_8_ = local_378._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_288 + 0xd),"in mappe",8);
      builtin_strncpy((char *)((long)local_288 + 0x15),"d buffer",8);
      *(undefined8 *)local_288 = 0x2064696c61766e49;
      ((TestLog *)((long)local_288 + 8))->m_log = (qpTestLog *)0x206e692061746164;
      auStack_280._0_8_ = local_378._M_dataplus._M_p;
      local_378._M_dataplus._M_p[(long)local_288] = '\0';
      tcu::ResultCollector::fail(&local_a8,(string *)local_288);
      if (local_288 != (undefined1  [8])((long)auStack_280 + 8)) {
        operator_delete((void *)local_288,(ulong)(auStack_280._8_8_ + 1));
      }
    }
    sVar20 = local_340;
    (**(code **)(local_340 + 0x40))(0x8c2a,0);
    dVar12 = (**(code **)(sVar20 + 0x800))();
    glu::checkError(dVar12,"Failed to update data with glMapBufferRange()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                    ,0x221);
    uVar13 = (int)local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
             (int)local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if ((int)uVar13 < 1) {
      TVar26 = local_350;
      if ((TestLog *)
          local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (TestLog *)0x0) goto LAB_0189e198;
    }
    else {
      uVar17 = (ulong)(uVar13 & 0x7fffffff);
      lVar24 = 0;
      do {
        pcVar25[lVar24] =
             *(char *)((long)(qpTestLog **)
                             local_2b8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar24);
        lVar24 = lVar24 + 1;
      } while (uVar17 + (uVar17 == 0) != lVar24);
    }
    operator_delete(local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    TVar26 = local_350;
  }
LAB_0189e198:
  tcu::TestLog::endSection(local_f0.m_log);
LAB_0189e1a5:
  if (postRender != RENDERBITS_NONE) {
    local_378._M_dataplus._M_p = (pointer)0x300000008;
    pvVar23 = (void *)local_2d0.m_pixels.m_cap;
    if ((void *)local_2d0.m_pixels.m_cap != (void *)0x0) {
      pvVar23 = local_2d0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,(TextureFormat *)&local_378,local_2d0.m_width,
               local_2d0.m_height,1,pvVar23);
    render((TestLog *)TVar26,context,postRender,(Random *)local_348,postRenderProgram,
           (TextureBuffer *)local_330,(PixelBufferAccess *)local_288);
  }
  glu::TextureBuffer::~TextureBuffer((TextureBuffer *)local_330);
  local_288._0_4_ = RGBA;
  local_288._4_4_ = UNORM_INT8;
  if ((void *)local_2d0.m_pixels.m_cap != (void *)0x0) {
    local_2d0.m_pixels.m_cap = (size_t)local_2d0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_330,(TextureFormat *)local_288,local_2d0.m_width,
             local_2d0.m_height,1,(void *)local_2d0.m_pixels.m_cap);
  local_288 = (undefined1  [8])((long)auStack_280 + 8);
  local_378._M_dataplus._M_p = (pointer)0x16;
  local_288 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_288,(ulong)&local_378)
  ;
  auStack_280._8_8_ = local_378._M_dataplus._M_p;
  *(undefined8 *)local_288 = 0x7320796669726556;
  builtin_strncpy((char *)((long)local_288 + 8),"creen co",8);
  builtin_strncpy((char *)((long)local_288 + 0xe),"contents",8);
  auStack_280._0_8_ = local_378._M_dataplus._M_p;
  local_378._M_dataplus._M_p[(long)local_288] = '\0';
  local_2f8._M_dataplus._M_p = (pointer)0x16;
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  local_378._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_378,(ulong)&local_2f8);
  local_378.field_2._M_allocated_capacity = (size_type)local_2f8._M_dataplus._M_p;
  builtin_strncpy(local_378._M_dataplus._M_p,"Verify screen contents",0x16);
  local_378._M_string_length = (size_type)local_2f8._M_dataplus._M_p;
  local_378._M_dataplus._M_p[(long)local_2f8._M_dataplus._M_p] = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_2b8,(TestLog *)local_350,(string *)local_288,&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  TVar26 = local_350;
  if (local_288 != (undefined1  [8])((long)auStack_280 + 8)) {
    operator_delete((void *)local_288,auStack_280._8_8_ + 1);
  }
  tcu::Surface::Surface((Surface *)&local_378,(deUint32)local_328,local_328._4_4_);
  local_2f8._M_dataplus._M_p = (pointer)0x300000008;
  uVar19 = local_378.field_2._M_allocated_capacity;
  if ((void *)local_378.field_2._M_allocated_capacity != (void *)0x0) {
    uVar19 = local_378._M_string_length;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_288,(TextureFormat *)&local_2f8,
             (int)local_378._M_dataplus._M_p,local_378._M_dataplus._M_p._4_4_,1,(void *)uVar19);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_288);
  local_2f8._M_dataplus._M_p = (pointer)0x300000008;
  uVar19 = local_378.field_2._M_allocated_capacity;
  if ((void *)local_378.field_2._M_allocated_capacity != (void *)0x0) {
    uVar19 = local_378._M_string_length;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_288,(TextureFormat *)&local_2f8,
             (int)local_378._M_dataplus._M_p,local_378._M_dataplus._M_p._4_4_,1,(void *)uVar19);
  bVar6 = tcu::fuzzyCompare((TestLog *)TVar26,"Result of rendering","Result of rendering",
                            (ConstPixelBufferAccess *)local_330,(ConstPixelBufferAccess *)local_288,
                            0.05,COMPARE_LOG_RESULT);
  if (!bVar6) {
    local_288 = (undefined1  [8])((long)auStack_280 + 8);
    local_2f8._M_dataplus._M_p = (pointer)0x10;
    local_288 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_288,(ulong)&local_2f8);
    auStack_280._8_8_ = local_2f8._M_dataplus._M_p;
    *(undefined8 *)local_288 = 0x6e697265646e6552;
    builtin_strncpy((char *)((long)local_288 + 8),"g failed",8);
    auStack_280._0_8_ = local_2f8._M_dataplus._M_p;
    local_2f8._M_dataplus._M_p[(long)local_288] = '\0';
    tcu::ResultCollector::fail(&local_a8,(string *)local_288);
    if (local_288 != (undefined1  [8])((long)auStack_280 + 8)) {
      operator_delete((void *)local_288,auStack_280._8_8_ + 1);
    }
  }
  tcu::Surface::~Surface((Surface *)&local_378);
  tcu::TestLog::endSection
            ((TestLog *)
             local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::ResultCollector::setTestContextResult(&local_a8,local_c8);
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_message._M_dataplus._M_p != &local_a8.m_message.field_2) {
    operator_delete(local_a8.m_message._M_dataplus._M_p,
                    local_a8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_prefix._M_dataplus._M_p != &local_a8.m_prefix.field_2) {
    operator_delete(local_a8.m_prefix._M_dataplus._M_p,
                    local_a8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void runTests (tcu::TestContext&	testCtx,
			   glu::RenderContext&	renderContext,
			   de::Random&			rng,
			   deUint32				format,
			   size_t				bufferSize,
			   size_t				offset,
			   size_t				size,
			   RenderBits			preRender,
			   glu::ShaderProgram*	preRenderProgram,
			   ModifyBits			modifyType,
			   RenderBits			postRender,
			   glu::ShaderProgram*	postRenderProgram)
{
	const tcu::RenderTarget	renderTarget	(renderContext.getRenderTarget());
	const glw::Functions&	gl				= renderContext.getFunctions();

	const int				width			= de::min<int>(renderTarget.getWidth(), MAX_VIEWPORT_WIDTH);
	const int				height			= de::min<int>(renderTarget.getHeight(), MAX_VIEWPORT_HEIGHT);
	const tcu::Vec4			clearColor		(0.25f, 0.5f, 0.75f, 1.0f);

	TestLog&				log				= testCtx.getLog();
	tcu::ResultCollector	resultCollector	(log);

	logImplementationInfo(log, renderContext);
	logTextureInfo(log, format, bufferSize, offset, size);

	{
		tcu::Surface			referenceTarget	(width, height);
		vector<deUint8>			bufferData;

		genRandomCoords(rng, bufferData, 0, bufferSize);

		for (deUint8 i = 0; i < 4; i++)
		{
			const deUint8 val = extend2BitsToByte(i);

			if (val >= offset && val < offset + size)
			{
				bufferData[val*2 + 0] = (i / 2 == 0 ? extend2BitsToByte(0x2u) : extend2BitsToByte(0x01u));
				bufferData[val*2 + 1] = (i % 2 == 0 ? extend2BitsToByte(0x2u) : extend2BitsToByte(0x01u));
			}
		}

		{
			glu::TextureBuffer texture (renderContext, format, bufferSize, offset, size, &(bufferData[0]));

			TCU_CHECK_MSG(width >= MIN_VIEWPORT_WIDTH || height >= MIN_VIEWPORT_HEIGHT, "Too small viewport");

			DE_ASSERT(preRender == 0 || preRenderProgram);
			DE_ASSERT(postRender == 0 || postRenderProgram);

			gl.viewport(0, 0, width, height);
			gl.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Screen setup failed");

			tcu::clear(referenceTarget.getAccess(), clearColor);

			texture.upload();

			if (preRender != 0)
				render(log, renderContext, preRender, rng, *preRenderProgram, texture, referenceTarget.getAccess());

			if (modifyType != 0)
				modify(log, resultCollector, renderContext, modifyType, rng, texture);

			if (postRender != 0)
				render(log, renderContext, postRender, rng, *postRenderProgram, texture, referenceTarget.getAccess());
		}

		verifyScreen(log, resultCollector, renderContext, referenceTarget.getAccess());

		resultCollector.setTestContextResult(testCtx);
	}
}